

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O2

void __thiscall gulcalc::outputmode1data(gulcalc *this,int event_id)

{
  int iVar1;
  rd_option rVar2;
  pointer pvVar3;
  pointer ppVar4;
  pointer ppVar5;
  double dVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  pointer ppVar10;
  pointer ppVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int sample_id;
  ulong uVar16;
  int *piVar17;
  ulong uVar18;
  OASIS_FLOAT OVar19;
  OASIS_FLOAT rval;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 uVar23;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 uVar24;
  OASIS_FLOAT local_138;
  int local_120;
  gulItemIDLoss gi;
  int local_f0;
  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
  gilv0;
  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
  gilv;
  int local_98;
  undefined1 local_84 [12];
  long local_78;
  long local_70;
  int *local_68;
  ulong local_60;
  float local_58;
  undefined4 uStack_54;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  piVar17 = (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_70 = (long)(int)this->rnd_->buffersize_;
  local_78 = (long)event_id;
  lVar9 = local_78 * 0x73d3fc6f;
  do {
    if (piVar17 ==
        (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      clearmode1_data(this);
      return;
    }
    gilv.
    super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    gilv.
    super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    gilv.
    super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    gilv0.
    super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    gilv0.
    super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    gilv0.
    super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
    ::resize(&gilv,(long)(this->num_idx_ + this->samplesize_ + 1));
    if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
      std::
      vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ::resize(&gilv0,(long)(this->num_idx_ + this->samplesize_ + 1));
    }
    iVar1 = *piVar17;
    pvVar3 = (this->mode1_stats_).
             super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = pvVar3[iVar1].super__Vector_base<processrecData,_std::allocator<processrecData>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar5 = *(pointer *)
              ((long)&pvVar3[iVar1].
                      super__Vector_base<processrecData,_std::allocator<processrecData>_>._M_impl.
                      super__Vector_impl_data + 8);
    if ((long)ppVar5 - (long)ppVar4 == 0) {
      local_138 = 0.0;
      dVar6 = 0.0;
    }
    else {
      local_138 = (this->coverages_->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar1];
      dVar6 = (double)(local_138 / (float)(ulong)(((long)ppVar5 - (long)ppVar4) / 0x30));
    }
    uVar16 = 0;
    ppVar10 = ppVar5;
    ppVar11 = ppVar4;
    local_68 = piVar17;
    while (piVar17 = local_68, uVar16 < (ulong)(((long)ppVar10 - (long)ppVar11) / 0x30)) {
      lVar13 = uVar16 * 0x30;
      gi.item_id = ppVar11[uVar16].item_id;
      gi.loss = (double)ppVar11[uVar16].max_loss;
      std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                (gilv.
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)this->num_idx_ + -5,&gi);
      if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
        std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                  (gilv0.
                   super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)this->num_idx_ + -5,&gi);
      }
      gi.loss = dVar6;
      std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                (gilv.
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)this->num_idx_ + -3,&gi);
      if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
        std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                  (gilv0.
                   super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)this->num_idx_ + -3,&gi);
      }
      gi.loss = (double)*(float *)(*(long *)&(this->mode1_stats_).
                                             super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[iVar1].
                                             super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                             ._M_impl.super__Vector_impl_data + 4 + lVar13);
      std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                (gilv.
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)this->num_idx_ + -2,&gi);
      if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
        std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                  (gilv0.
                   super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)this->num_idx_ + -2,&gi);
      }
      gi.loss = (double)*(float *)(*(long *)&(this->mode1_stats_).
                                             super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[iVar1].
                                             super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                             ._M_impl.super__Vector_impl_data + lVar13);
      std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                (gilv.
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)this->num_idx_ + -1,&gi);
      if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
        std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::push_back
                  (gilv0.
                   super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)this->num_idx_ + -1,&gi);
      }
      rVar2 = this->rndopt_;
      if (rVar2 == usecachedvector) {
        local_120 = this->samplesize_;
        local_f0 = *(int *)(*(long *)&(this->mode1_stats_).
                                      super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[iVar1].
                                      super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                      ._M_impl.super__Vector_impl_data + 0x10 + lVar13) * local_120;
      }
      else if (rVar2 == usehashedseed) {
        local_98 = (int)(lVar9 % 0x80000000);
        getRands::seedRands(this->rnd_,
                            *(int *)(*(long *)&(this->mode1_stats_).
                                               super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[iVar1].
                                               super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                               ._M_impl.super__Vector_impl_data + 0x10 + lVar13) *
                            0x5bfc6fdb + local_98 + this->rand_seed_ & 0x7fffffff);
        local_f0 = 0;
        if (this->correlatedWriter_ == (_func_void_void_ptr_int_int *)0x0) {
          local_120 = 0;
        }
        else {
          getRands::seedRands(this->rnd0_,this->rand_seed_ + local_98 & 0x7fffffff);
          local_120 = 0;
        }
      }
      else {
        if (rVar2 != userandomnumberfile) {
          fprintf(_stderr,"FATAL: %s: Unknown random number option\n","outputmode1data");
          exit(-1);
        }
        lVar15 = this->p3_ * this->p1_;
        lVar12 = this->p2_ * local_78;
        local_f0 = (int)((*(int *)(*(long *)&(this->mode1_stats_).
                                             super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[iVar1].
                                             super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                             ._M_impl.super__Vector_impl_data + 0x10 + lVar13) *
                          lVar15 + lVar12) % local_70);
        local_120 = (int)((lVar12 + lVar15) % local_70);
      }
      sample_id = 0;
      local_60 = uVar16;
LAB_001035ad:
      if (sample_id < this->samplesize_) {
        if (this->rndopt_ == usehashedseed) {
          OVar19 = getRands::nextrnd(this->rnd_);
          uVar23 = extraout_XMM0_Dc;
          uVar24 = extraout_XMM0_Dd;
          if (this->correlatedWriter_ == (_func_void_void_ptr_int_int *)0x0) {
LAB_00103629:
            rval = 0.0;
            uStack_44 = 0;
            uStack_40 = 0;
            uStack_3c = 0;
          }
          else {
            rval = getRands::nextrnd(this->rnd0_);
            uVar23 = extraout_XMM0_Dc_00;
            uVar24 = extraout_XMM0_Dd_00;
            uStack_44 = extraout_XMM0_Db;
            uStack_40 = extraout_XMM0_Dc_00;
            uStack_3c = extraout_XMM0_Dd_00;
          }
        }
        else {
          OVar19 = getRands::rnd(this->rnd_,sample_id + local_f0);
          uVar23 = extraout_XMM0_Dc_01;
          uVar24 = extraout_XMM0_Dd_01;
          if (this->correlatedWriter_ == (_func_void_void_ptr_int_int *)0x0) goto LAB_00103629;
          rval = getRands::rnd(this->rnd0_,sample_id + local_120);
          uVar23 = extraout_XMM0_Dc_02;
          uVar24 = extraout_XMM0_Dd_02;
          uStack_44 = extraout_XMM0_Db_00;
          uStack_40 = extraout_XMM0_Dc_02;
          uStack_3c = extraout_XMM0_Dd_02;
        }
        lVar12 = *(long *)&(this->mode1_stats_).
                           super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar1].
                           super__Vector_base<processrecData,_std::allocator<processrecData>_>.
                           _M_impl.super__Vector_impl_data;
        lVar15 = *(long *)(lVar12 + 0x20 + lVar13);
        fVar21 = (this->bin_lookup_).super__Vector_base<prob_mean,_std::allocator<prob_mean>_>.
                 _M_impl.super__Vector_impl_data._M_start[*(int *)(lVar15 + -4)].prob_to;
        uStack_54 = (undefined4)((ulong)((double)fVar21 + -3e-08) >> 0x20);
        fVar20 = (float)((double)fVar21 + -3e-08);
        if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
          rval = (OASIS_FLOAT)
                 (-(uint)(rval < fVar21) & (uint)rval | ~-(uint)(rval < fVar21) & (uint)fVar20);
          uStack_44 = uStack_54;
          uStack_40 = uVar23;
          uStack_3c = uVar24;
        }
        uVar14 = (ulong)(lVar15 - *(long *)(lVar12 + 0x18 + lVar13)) >> 2;
        sample_id = sample_id + 1;
        uVar18 = 0;
        uVar16 = uVar14 & 0xffffffff;
        if ((int)uVar14 < 1) {
          uVar16 = uVar18;
        }
        fVar20 = (float)(-(uint)(OVar19 < fVar21) & (uint)OVar19 |
                        ~-(uint)(OVar19 < fVar21) & (uint)fVar20);
        bVar7 = false;
        bVar8 = false;
        fVar21 = 0.0;
        local_58 = fVar20;
        local_48 = rval;
        for (; uVar16 != uVar18; uVar18 = uVar18 + 1) {
          local_84._4_8_ =
               (this->bin_lookup_).super__Vector_base<prob_mean,_std::allocator<prob_mean>_>._M_impl
               .super__Vector_impl_data._M_start
               [*(int *)(*(long *)(*(long *)&(this->mode1_stats_).
                                             super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[iVar1].
                                             super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                             ._M_impl.super__Vector_impl_data + 0x18 + lVar13) +
                        uVar18 * 4)];
          fVar22 = (float)local_84._4_8_;
          local_84._0_4_ = fVar21;
          if ((fVar20 < fVar22) && (!bVar7)) {
            fillgulitemloss(this,gi.item_id,local_138,event_id,(int)uVar18,fVar20,
                            (probrec *)local_84,sample_id,&gilv);
            bVar7 = true;
            rval = local_48;
            fVar20 = local_58;
            if (this->correlatedWriter_ == (_func_void_void_ptr_int_int *)0x0) break;
          }
          if (((this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) && (rval < fVar22))
             && (!bVar8)) {
            bVar8 = true;
            fillgulitemloss(this,gi.item_id,local_138,event_id,(int)uVar18,rval,(probrec *)local_84,
                            sample_id,&gilv0);
            rval = local_48;
            fVar20 = local_58;
          }
          if ((bVar7) && (bVar8)) break;
          fVar21 = fVar22;
        }
        goto LAB_001035ad;
      }
      pvVar3 = (this->mode1_stats_).
               super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar11 = pvVar3[iVar1].super__Vector_base<processrecData,_std::allocator<processrecData>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppVar10 = *(pointer *)
                 ((long)&pvVar3[iVar1].
                         super__Vector_base<processrecData,_std::allocator<processrecData>_>._M_impl
                         .super__Vector_impl_data + 8);
      uVar16 = local_60 + 1;
    }
    if ((ppVar5 != ppVar4) &&
       (writemode1output(this,event_id,local_138,&gilv,false),
       this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0)) {
      writemode1output(this,event_id,local_138,&gilv0,true);
    }
    piVar17 = piVar17 + 1;
    std::
    vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
    ::~vector(&gilv0);
    std::
    vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
    ::~vector(&gilv);
  } while( true );
}

Assistant:

void gulcalc::outputmode1data(int event_id) {

	int rnd_count = rnd_->rdxmax();

	auto cov_iter = mode1UsedCoverageIDs_.begin();
	while (cov_iter != mode1UsedCoverageIDs_.end()) {

		std::vector<std::vector<gulItemIDLoss>> gilv;
		std::vector<std::vector<gulItemIDLoss>> gilv0;
		gilv.resize(samplesize_ + num_idx_ + 1);
		if (correlatedWriter_) gilv0.resize(samplesize_ + num_idx_ + 1);
		int j = *cov_iter;
		OASIS_FLOAT tiv = 0.0;
		OASIS_FLOAT exposureValue = 0.0;
		bool hasData = false;
		if (mode1_stats_[j].size() > 0) {
			tiv = (*coverages_)[j];
			exposureValue = tiv / mode1_stats_[j].size();
			hasData = true;
		}

		for (size_t i = 0; i < mode1_stats_[j].size(); i++) {

			gulItemIDLoss gi;
			gi.item_id = mode1_stats_[j][i].item_id;

			// maximum loss
			gi.loss = mode1_stats_[j][i].max_loss;
			gilv[max_loss_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[max_loss_idx + num_idx_].push_back(gi);

			// exposure value record
			// tiv / count(tuple(event_id-coverage_id))
			gi.loss = exposureValue;
			gilv[tiv_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[tiv_idx + num_idx_].push_back(gi);

			// standard deviation
			gi.loss = mode1_stats_[j][i].std_dev;
			gilv[std_dev_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[std_dev_idx + num_idx_].push_back(gi);

			// mean
			gi.loss = mode1_stats_[j][i].gul_mean;
			gilv[mean_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[mean_idx + num_idx_].push_back(gi);

			int ridx = 0;
			int ridx0 = 0;
			switch (rndopt_) {
				case rd_option::userandomnumberfile:
					ridx = ((mode1_stats_[j][i].group_id * p1_ * p3_) + (event_id * p2_)) % rnd_count;
					ridx0 = ((p1_ * p3_) + (event_id * p2_)) % rnd_count;
					break;
				case rd_option::usecachedvector:
					ridx = mode1_stats_[j][i].group_id * samplesize_;
					ridx0 = samplesize_;
					break;
				case rd_option::usehashedseed:
				{
					unsigned long long s1 = (mode1_stats_[j][i].group_id * 1543270363L) % 2147483648L;   // hash group_id and event_id to seed random number
					unsigned long long s2 = (event_id * 1943272559L) % 2147483648L;
					s1 = (s1 + s2 + rand_seed_) % 2147483648L;
					rnd_->seedRands(s1);
					if (correlatedWriter_) {
						s2 = (s2 + rand_seed_) % 2147483648L;
						rnd0_->seedRands(s2);
					}
				}
				break;
				default:
					fprintf(stderr, "FATAL: %s: Unknown random number option\n", __func__);
					exit(-1);
			}

			// Generate losses for each sample
			for (int k = 0; k < samplesize_; k++) {

				OASIS_FLOAT rval;
				OASIS_FLOAT rval0 = 0;

				if (rndopt_ == rd_option::usehashedseed) {
					rval = rnd_->nextrnd();
					if (correlatedWriter_) rval0 = rnd0_->nextrnd();
				} else {
					rval = rnd_->rnd(ridx + k);
					if (correlatedWriter_) rval0 = rnd0_->rnd(ridx0 + k);
				}

				// If required set random number to just under
				// maximum prob_to (which should be 1)
				OASIS_FLOAT prob_to_max = bin_lookup_[mode1_stats_[j][i].bin_map_ids.back()].prob_to;
				if (rval >= prob_to_max) {
					rval = prob_to_max - 0.00000003;
				}
				if (correlatedWriter_ && rval0 >= prob_to_max) {
					rval0 = prob_to_max - 0.00000003;
				}

				OASIS_FLOAT last_prob_to = 0;
				bool hit_rval = false;
				bool hit_rval0 = false;
				int max_bin_end = (int)mode1_stats_[j][i].bin_map_ids.size();
				for (int bin_index = 0; bin_index < max_bin_end; bin_index++) {

					prob_mean pp = bin_lookup_[mode1_stats_[j][i].bin_map_ids[bin_index]];
					probrec p;
					p.prob_from = last_prob_to;
					p.prob_to = pp.prob_to;
					p.bin_mean = pp.bin_mean;
					last_prob_to = pp.prob_to;

					if (rval < p.prob_to && !hit_rval) {
						fillgulitemloss(gi.item_id, tiv, event_id, bin_index, rval, p, k+1, gilv);
						if (!correlatedWriter_) break;
						else hit_rval = true;
					}
					if (correlatedWriter_ && rval0 < p.prob_to && !hit_rval0) {
						fillgulitemloss(gi.item_id, tiv, event_id, bin_index, rval0, p, k+1, gilv0);
						hit_rval0 = true;
					}
					if (hit_rval && hit_rval0) break;

				}

			}

		}

		if (hasData) {

			writemode1output(event_id, tiv, gilv);
			if (correlatedWriter_) {
				writemode1output(event_id, tiv, gilv0, true);
			}

		}

		cov_iter++;

	}

	clearmode1_data();

}